

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

LY_ERR lyd_validate_choice_r
                 (lyd_node **first,lysc_node *sparent,lys_module *mod,lysc_ext_instance *ext,
                 uint32_t val_opts,uint32_t int_opts,ly_ht *getnext_ht,lyd_node **diff)

{
  uint uVar1;
  LY_ERR LVar2;
  lyd_node *plVar3;
  lysc_node *plVar4;
  lyd_node *node;
  lysc_node *plVar5;
  bool bVar6;
  lysc_node **pplVar7;
  lysc_node *plVar8;
  lysc_node *plVar9;
  lysc_node *parent;
  LY_ERR local_7c;
  lysc_node *local_60;
  lysc_ext_instance *local_58;
  lysc_node *local_50;
  ulong local_48;
  lysc_node **choices;
  lysc_node **snodes;
  
  local_58 = ext;
  local_7c = lyd_val_getnext_get(sparent,mod,ext,(byte)int_opts & 4,getnext_ht,&choices,&snodes);
  if (choices != (lysc_node **)0x0 && local_7c == LY_SUCCESS) {
    local_7c = LY_SUCCESS;
    uVar1 = 0;
    pplVar7 = choices;
    while (*first != (lyd_node *)0x0) {
      local_48 = (ulong)uVar1;
      plVar4 = pplVar7[local_48];
      if (plVar4 == (lysc_node *)0x0) {
        return local_7c;
      }
      ly_log_location(plVar4,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      plVar8 = (lysc_node *)0x0;
      parent = (lysc_node *)0x0;
      local_50 = plVar4;
      for (plVar9 = plVar4 + 1; plVar9 = *(lysc_node **)plVar9, plVar9 != (lysc_node *)0x0;
          plVar9 = (lysc_node *)&plVar9->next) {
        local_60 = (lysc_node *)0x0;
        plVar3 = (lyd_node *)0x0;
        bVar6 = false;
        do {
          plVar3 = lys_getnext_data(plVar3,*first,&local_60,plVar9,(lysc_module *)0x0);
          plVar4 = parent;
          if (plVar3 == (lyd_node *)0x0) {
            plVar5 = plVar8;
            if ((!bVar6) || (plVar4 = plVar9, plVar8 = parent, parent == (lysc_node *)0x0))
            goto LAB_001a9a53;
            goto LAB_001a9b09;
          }
          bVar6 = true;
        } while ((plVar3->flags & 4) == 0);
        plVar5 = plVar9;
        if (plVar8 != (lysc_node *)0x0) {
LAB_001a9b09:
          ly_vlog(local_50->module->ctx,(char *)0x0,LYVE_DATA,
                  "Data for both cases \"%s\" and \"%s\" exist.",plVar8->name,plVar9->name);
          ly_log_location_revert(1,0,0,0);
          LVar2 = LY_EVALID;
          goto joined_r0x001a9b55;
        }
LAB_001a9a53:
        plVar8 = plVar5;
        parent = plVar4;
      }
      ly_log_location_revert(1,0,0,0);
      if (plVar8 != (lysc_node *)0x0 && parent != (lysc_node *)0x0) {
        local_60 = (lysc_node *)0x0;
        plVar3 = (lyd_node *)0x0;
        do {
          node = lys_getnext_data(plVar3,*first,&local_60,parent,(lysc_module *)0x0);
          lyd_del_move_root(first,plVar3,mod);
          lyd_free_tree(plVar3);
          if (node == (lyd_node *)0x0) goto LAB_001a9b57;
          plVar3 = node;
        } while ((diff == (lyd_node **)0x0) ||
                (LVar2 = lyd_val_diff_add(node,LYD_DIFF_OP_DELETE,diff), LVar2 == LY_SUCCESS));
        if (LVar2 != LY_EVALID) {
          return LVar2;
        }
joined_r0x001a9b55:
        local_7c = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LVar2;
        }
      }
LAB_001a9b57:
      pplVar7 = choices;
      LVar2 = lyd_validate_choice_r
                        (first,choices[local_48],mod,local_58,val_opts,int_opts,getnext_ht,diff);
      if (LVar2 != LY_SUCCESS) {
        if (LVar2 != LY_EVALID) {
          return LVar2;
        }
        local_7c = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
      uVar1 = uVar1 + 1;
    }
  }
  return local_7c;
}

Assistant:

static LY_ERR
lyd_validate_choice_r(struct lyd_node **first, const struct lysc_node *sparent, const struct lys_module *mod,
        const struct lysc_ext_instance *ext, uint32_t val_opts, uint32_t int_opts, struct ly_ht *getnext_ht,
        struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    const struct lysc_node **choices, **snodes;
    uint32_t i;

    /* get cached getnext schema nodes */
    rc = lyd_val_getnext_get(sparent, mod, ext, int_opts & LYD_INTOPT_REPLY, getnext_ht, &choices, &snodes);
    LY_CHECK_GOTO(rc, cleanup);
    if (!choices) {
        goto cleanup;
    }

    for (i = 0; *first && choices[i]; ++i) {
        /* check case duplicites */
        r = lyd_validate_cases(first, mod, (struct lysc_node_choice *)choices[i], diff);
        LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

        /* check for nested choice */
        r = lyd_validate_choice_r(first, choices[i], mod, ext, val_opts, int_opts, getnext_ht, diff);
        LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);
    }

cleanup:
    return rc;
}